

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void warp_horizontal_filter_avx2
               (uint8_t *ref,__m256i *horz_out,int stride,int32_t ix4,int32_t iy4,int32_t sx4,
               int alpha,int beta,int p_height,int height,int i,__m256i *round_const,__m128i *shift,
               __m256i *shuffle_src)

{
  __m256i src;
  int iVar1;
  int in_ECX;
  int in_EDX;
  longlong unaff_RBP;
  long in_RDI;
  int in_R8D;
  undefined1 in_stack_00000000 [16];
  undefined4 in_stack_00000014;
  __m128i src_1;
  __m128i src_0;
  __m256i coeff [4];
  int row;
  int sx;
  int iy;
  int k;
  undefined4 in_stack_fffffffffffffe70;
  int low;
  undefined4 local_188;
  __m256i *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  __m256i *in_stack_fffffffffffffef0;
  __m256i in_stack_fffffffffffffef8;
  undefined4 local_8c;
  int in_stack_ffffffffffffffcc;
  __m128i *in_stack_ffffffffffffffd0;
  __m256i *in_stack_ffffffffffffffd8;
  __m256i *in_stack_ffffffffffffffe0;
  __m256i *in_stack_ffffffffffffffe8;
  __m256i *in_stack_fffffffffffffff0;
  
  local_8c = -7;
  while( true ) {
    if (beta - height < 9) {
      local_188 = beta - height;
    }
    else {
      local_188 = 8;
    }
    if (local_188 + -2 < local_8c) break;
    low = 0;
    iVar1 = clamp(in_R8D + local_8c,0,p_height + -1);
    in_stack_fffffffffffffed8 = *(__m256i **)((long)in_ECX + in_RDI + iVar1 * in_EDX + 1);
    clamp(in_R8D + 1 + local_8c,low,p_height + -1);
    in_stack_ffffffffffffffcc = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    horizontal_filter_avx2
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,round_const,
               (__m128i *)CONCAT44(low,in_stack_fffffffffffffe70));
    local_8c = local_8c + 2;
  }
  clamp(in_R8D + local_8c,0,p_height + -1);
  prepare_horizontal_filter_coeff
            (in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  src[3]._0_4_ = alpha;
  src._8_16_ = in_stack_00000000;
  src[3]._4_4_ = in_stack_00000014;
  src[0] = unaff_RBP;
  filter_src_pixels_avx2
            (src,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

static inline void warp_horizontal_filter_avx2(
    const uint8_t *ref, __m256i *horz_out, int stride, int32_t ix4, int32_t iy4,
    int32_t sx4, int alpha, int beta, int p_height, int height, int i,
    const __m256i *round_const, const __m128i *shift,
    const __m256i *shuffle_src) {
  int k, iy, sx, row = 0;
  __m256i coeff[4];
  for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
    iy = iy4 + k;
    iy = clamp(iy, 0, height - 1);
    const __m128i src_0 =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    iy = iy4 + k + 1;
    iy = clamp(iy, 0, height - 1);
    const __m128i src_1 =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    const __m256i src_01 =
        _mm256_inserti128_si256(_mm256_castsi128_si256(src_0), src_1, 0x1);
    sx = sx4 + beta * (k + 4);
    horizontal_filter_avx2(src_01, horz_out, sx, alpha, beta, row, shuffle_src,
                           round_const, shift);
    row += 1;
  }
  iy = iy4 + k;
  iy = clamp(iy, 0, height - 1);
  const __m256i src_01 = _mm256_castsi128_si256(
      _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7)));
  sx = sx4 + beta * (k + 4);
  prepare_horizontal_filter_coeff(alpha, sx, coeff);
  filter_src_pixels_avx2(src_01, horz_out, coeff, shuffle_src, round_const,
                         shift, row);
}